

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_Browse_single
               (UA_Server *server,UA_Session *session,ContinuationPointEntry *cp,
               UA_BrowseDescription *descr,UA_UInt32 maxrefs,UA_BrowseResult *result)

{
  ContinuationPointEntry **ppCVar1;
  UA_StatusCode UVar2;
  void *pvVar3;
  UA_Node *curr;
  UA_Guid *pUVar4;
  UA_Guid UVar5;
  undefined8 local_b0;
  UA_Byte local_a8 [8];
  UA_Guid *ident;
  UA_Node *current;
  UA_StatusCode retval;
  UA_Boolean isExternal;
  size_t skipped;
  size_t real_maxrefs;
  UA_Node *node;
  UA_Node *rootRef;
  UA_NodeId *pUStack_60;
  UA_Boolean all_refs;
  UA_NodeId *relevant_refs;
  size_t relevant_refs_size;
  ulong uStack_48;
  UA_UInt32 continuationIndex;
  size_t referencesIndex;
  size_t referencesCount;
  UA_BrowseResult *result_local;
  UA_BrowseDescription *pUStack_28;
  UA_UInt32 maxrefs_local;
  UA_BrowseDescription *descr_local;
  ContinuationPointEntry *cp_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  referencesIndex = 0;
  uStack_48 = 0;
  relevant_refs_size._4_4_ = 0;
  result_local._4_4_ = maxrefs;
  pUStack_28 = descr;
  if (cp != (ContinuationPointEntry *)0x0) {
    pUStack_28 = &cp->browseDescription;
    result_local._4_4_ = cp->maxReferences;
    relevant_refs_size._4_4_ = cp->continuationIndex;
  }
  if (((pUStack_28->browseDirection == UA_BROWSEDIRECTION_BOTH) ||
      (pUStack_28->browseDirection == UA_BROWSEDIRECTION_FORWARD)) ||
     (pUStack_28->browseDirection == UA_BROWSEDIRECTION_INVERSE)) {
    relevant_refs = (UA_NodeId *)0x0;
    pUStack_60 = (UA_NodeId *)0x0;
    referencesCount = (size_t)result;
    descr_local = (UA_BrowseDescription *)cp;
    cp_local = (ContinuationPointEntry *)session;
    session_local = (UA_Session *)server;
    rootRef._7_1_ = UA_NodeId_isNull(&pUStack_28->referenceTypeId);
    if (!(bool)rootRef._7_1_) {
      node = UA_NodeStore_get((UA_NodeStore *)
                              (session_local->clientDescription).gatewayServerUri.data,
                              &pUStack_28->referenceTypeId);
      if ((node == (UA_Node *)0x0) || (node->nodeClass != UA_NODECLASS_REFERENCETYPE)) {
        *(undefined4 *)referencesCount = 0x804c0000;
        return;
      }
      if ((pUStack_28->includeSubtypes & 1U) == 0) {
        pUStack_60 = &pUStack_28->referenceTypeId;
        relevant_refs = (UA_NodeId *)0x1;
      }
      else {
        UVar2 = getTypeHierarchy((UA_NodeStore *)
                                 (session_local->clientDescription).gatewayServerUri.data,node,false
                                 ,&stack0xffffffffffffffa0,(size_t *)&relevant_refs);
        *(UA_StatusCode *)referencesCount = UVar2;
        if (*(int *)referencesCount != 0) {
          return;
        }
      }
    }
    real_maxrefs = (size_t)UA_NodeStore_get((UA_NodeStore *)
                                            (session_local->clientDescription).gatewayServerUri.data
                                            ,&pUStack_28->nodeId);
    if ((UA_Node *)real_maxrefs == (UA_Node *)0x0) {
      *(undefined4 *)referencesCount = 0x80340000;
      if (((rootRef._7_1_ & 1) == 0) && ((pUStack_28->includeSubtypes & 1U) != 0)) {
        UA_Array_delete(pUStack_60,(size_t)relevant_refs,UA_TYPES + 0x10);
      }
    }
    else if (((UA_Node *)real_maxrefs)->referencesSize == 0) {
      *(undefined8 *)(referencesCount + 0x18) = 0;
      if (((rootRef._7_1_ & 1) == 0) && ((pUStack_28->includeSubtypes & 1U) != 0)) {
        UA_Array_delete(pUStack_60,(size_t)relevant_refs,UA_TYPES + 0x10);
      }
    }
    else {
      skipped = (size_t)result_local._4_4_;
      if (skipped == 0) {
        skipped = ((UA_Node *)real_maxrefs)->referencesSize;
      }
      else if (((UA_Node *)real_maxrefs)->referencesSize < skipped) {
        skipped = ((UA_Node *)real_maxrefs)->referencesSize;
      }
      pvVar3 = UA_Array_new(skipped,UA_TYPES + 0x76);
      *(void **)(referencesCount + 0x20) = pvVar3;
      if (*(long *)(referencesCount + 0x20) == 0) {
        *(undefined4 *)referencesCount = 0x80030000;
      }
      else {
        _retval = 0;
        current._7_1_ = 0;
        current._0_4_ = 0;
        for (; uStack_48 < *(ulong *)(real_maxrefs + 0x80) && referencesIndex < skipped;
            uStack_48 = uStack_48 + 1) {
          current._7_1_ = 0;
          curr = returnRelevantNode((UA_Server *)session_local,pUStack_28,
                                    (UA_Boolean)(rootRef._7_1_ & 1),
                                    (UA_ReferenceNode *)
                                    (*(long *)(real_maxrefs + 0x88) + uStack_48 * 0x50),pUStack_60,
                                    (size_t)relevant_refs,(UA_Boolean *)((long)&current + 7));
          if (curr != (UA_Node *)0x0) {
            if (_retval < relevant_refs_size._4_4_) {
              _retval = _retval + 1;
            }
            else {
              UVar2 = fillReferenceDescription
                                ((UA_NodeStore *)
                                 (session_local->clientDescription).gatewayServerUri.data,curr,
                                 (UA_ReferenceNode *)
                                 (*(long *)(real_maxrefs + 0x88) + uStack_48 * 0x50),
                                 pUStack_28->resultMask,
                                 (UA_ReferenceDescription *)
                                 (*(long *)(referencesCount + 0x20) + referencesIndex * 0xc0));
              current._0_4_ = UVar2 | (uint)current;
              referencesIndex = referencesIndex + 1;
            }
          }
        }
        *(size_t *)(referencesCount + 0x18) = referencesIndex;
        if (referencesIndex == 0) {
          free(*(void **)(referencesCount + 0x20));
          *(undefined8 *)(referencesCount + 0x20) = 0;
          *(undefined8 *)(referencesCount + 0x18) = 0;
        }
        if ((uint)current != 0) {
          UA_Array_delete(*(void **)(referencesCount + 0x20),*(size_t *)(referencesCount + 0x18),
                          UA_TYPES + 0x76);
          *(undefined8 *)(referencesCount + 0x20) = 0;
          *(undefined8 *)(referencesCount + 0x18) = 0;
          *(uint *)referencesCount = (uint)current;
        }
      }
      if (((rootRef._7_1_ & 1) == 0) && ((pUStack_28->includeSubtypes & 1U) != 0)) {
        UA_Array_delete(pUStack_60,(size_t)relevant_refs,UA_TYPES + 0x10);
      }
      if (*(int *)referencesCount == 0) {
        if (descr_local == (UA_BrowseDescription *)0x0) {
          if ((result_local._4_4_ != UA_NODEIDTYPE_NUMERIC) &&
             (result_local._4_4_ <= referencesIndex)) {
            if ((*(short *)&cp_local[2].pointers.le_next == 0) ||
               (descr_local = (UA_BrowseDescription *)malloc(0x70),
               descr_local == (UA_BrowseDescription *)0x0)) {
              *(undefined4 *)referencesCount = 0x804b0000;
            }
            else {
              UA_BrowseDescription_copy
                        (pUStack_28,(UA_BrowseDescription *)&descr_local->referenceTypeId);
              descr_local[1].referenceTypeId.identifierType = result_local._4_4_;
              *(int *)&descr_local[1].referenceTypeId = (int)referencesIndex;
              pUVar4 = UA_Guid_new();
              UVar5 = UA_Guid_random();
              local_b0 = UVar5._0_8_;
              pUVar4->data1 = (undefined4)local_b0;
              pUVar4->data2 = local_b0._4_2_;
              pUVar4->data3 = local_b0._6_2_;
              local_a8 = UVar5.data4;
              *&pUVar4->data4 = local_a8;
              *(UA_Guid **)&descr_local->browseDirection = pUVar4;
              (descr_local->nodeId).identifier.string.data = (UA_Byte *)0x10;
              UA_ByteString_copy((UA_ByteString *)((long)&(descr_local->nodeId).identifier + 8),
                                 (UA_ByteString *)(referencesCount + 8));
              ppCVar1 = cp_local[2].pointers.le_prev;
              *(ContinuationPointEntry ***)&descr_local->nodeId = ppCVar1;
              if (ppCVar1 != (ContinuationPointEntry **)0x0) {
                cp_local[2].pointers.le_prev[1] = (ContinuationPointEntry *)descr_local;
              }
              cp_local[2].pointers.le_prev = (ContinuationPointEntry **)descr_local;
              (descr_local->nodeId).identifier.string.length = (size_t)&cp_local[2].pointers.le_prev
              ;
              *(short *)&cp_local[2].pointers.le_next = *(short *)&cp_local[2].pointers.le_next + -1
              ;
            }
          }
        }
        else if (uStack_48 == *(ulong *)(real_maxrefs + 0x80)) {
          removeCp((ContinuationPointEntry *)descr_local,(UA_Session *)cp_local);
        }
        else {
          *(int *)&descr_local[1].referenceTypeId =
               (int)referencesIndex + *(int *)&descr_local[1].referenceTypeId;
          UA_ByteString_copy((UA_ByteString *)((long)&(descr_local->nodeId).identifier + 8),
                             (UA_ByteString *)(referencesCount + 8));
        }
      }
    }
  }
  else {
    result->statusCode = 0x804d0000;
  }
  return;
}

Assistant:

void
Service_Browse_single(UA_Server *server, UA_Session *session,
                      struct ContinuationPointEntry *cp, const UA_BrowseDescription *descr,
                      UA_UInt32 maxrefs, UA_BrowseResult *result) { 
    size_t referencesCount = 0;
    size_t referencesIndex = 0;
    /* set the browsedescription if a cp is given */
    UA_UInt32 continuationIndex = 0;
    if(cp) {
        descr = &cp->browseDescription;
        maxrefs = cp->maxReferences;
        continuationIndex = cp->continuationIndex;
    }

    /* is the browsedirection valid? */
    if(descr->browseDirection != UA_BROWSEDIRECTION_BOTH &&
       descr->browseDirection != UA_BROWSEDIRECTION_FORWARD &&
       descr->browseDirection != UA_BROWSEDIRECTION_INVERSE) {
        result->statusCode = UA_STATUSCODE_BADBROWSEDIRECTIONINVALID;
        return;
    }
    
    /* get the references that match the browsedescription */
    size_t relevant_refs_size = 0;
    UA_NodeId *relevant_refs = NULL;
    UA_Boolean all_refs = UA_NodeId_isNull(&descr->referenceTypeId);
    if(!all_refs) {
        const UA_Node *rootRef = UA_NodeStore_get(server->nodestore, &descr->referenceTypeId);
        if(!rootRef || rootRef->nodeClass != UA_NODECLASS_REFERENCETYPE) {
            result->statusCode = UA_STATUSCODE_BADREFERENCETYPEIDINVALID;
            return;
        }
        if(descr->includeSubtypes) {
            result->statusCode = getTypeHierarchy(server->nodestore, rootRef, false,
                                                  &relevant_refs, &relevant_refs_size);
            if(result->statusCode != UA_STATUSCODE_GOOD)
                return;
        } else {
            relevant_refs = (UA_NodeId*)(uintptr_t)&descr->referenceTypeId;
            relevant_refs_size = 1;
        }
    }

    /* get the node */
    const UA_Node *node = UA_NodeStore_get(server->nodestore, &descr->nodeId);
    if(!node) {
        result->statusCode = UA_STATUSCODE_BADNODEIDUNKNOWN;
        if(!all_refs && descr->includeSubtypes)
            UA_Array_delete(relevant_refs, relevant_refs_size, &UA_TYPES[UA_TYPES_NODEID]);
        return;
    }

    /* if the node has no references, just return */
    if(node->referencesSize == 0) {
        result->referencesSize = 0;
        if(!all_refs && descr->includeSubtypes)
            UA_Array_delete(relevant_refs, relevant_refs_size, &UA_TYPES[UA_TYPES_NODEID]);
        return;
    }

    /* how many references can we return at most? */
    size_t real_maxrefs = maxrefs;
    if(real_maxrefs == 0)
        real_maxrefs = node->referencesSize;
    else if(real_maxrefs > node->referencesSize)
        real_maxrefs = node->referencesSize;
    result->references = UA_Array_new(real_maxrefs, &UA_TYPES[UA_TYPES_REFERENCEDESCRIPTION]);
    if(!result->references) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        goto cleanup;
    }

    /* loop over the node's references */
    size_t skipped = 0;
    UA_Boolean isExternal = false;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    for(; referencesIndex < node->referencesSize && referencesCount < real_maxrefs; ++referencesIndex) {
        isExternal = false;
        const UA_Node *current =
            returnRelevantNode(server, descr, all_refs, &node->references[referencesIndex],
                               relevant_refs, relevant_refs_size, &isExternal);
        if(!current)
            continue;

        if(skipped < continuationIndex) {
            ++skipped;
        } else {
            retval |= fillReferenceDescription(server->nodestore, current,
                                               &node->references[referencesIndex],
                                               descr->resultMask,
                                               &result->references[referencesCount]);
            ++referencesCount;
        }
    }
    result->referencesSize = referencesCount;

    if(referencesCount == 0) {
        UA_free(result->references);
        result->references = NULL;
        result->referencesSize = 0;
    }

    if(retval != UA_STATUSCODE_GOOD) {
        UA_Array_delete(result->references, result->referencesSize,
                        &UA_TYPES[UA_TYPES_REFERENCEDESCRIPTION]);
        result->references = NULL;
        result->referencesSize = 0;
        result->statusCode = retval;
    }

 cleanup:
    if(!all_refs && descr->includeSubtypes)
        UA_Array_delete(relevant_refs, relevant_refs_size, &UA_TYPES[UA_TYPES_NODEID]);
    if(result->statusCode != UA_STATUSCODE_GOOD)
        return;

    /* create, update, delete continuation points */
    if(cp) {
        if(referencesIndex == node->referencesSize) {
            /* all done, remove a finished continuationPoint */
            removeCp(cp, session);
        } else {
            /* update the cp and return the cp identifier */
            cp->continuationIndex += (UA_UInt32)referencesCount;
            UA_ByteString_copy(&cp->identifier, &result->continuationPoint);
        }
    } else if(maxrefs != 0 && referencesCount >= maxrefs) {
        /* create a cp */
        if(session->availableContinuationPoints <= 0 ||
           !(cp = UA_malloc(sizeof(struct ContinuationPointEntry)))) {
            result->statusCode = UA_STATUSCODE_BADNOCONTINUATIONPOINTS;
            return;
        }
        UA_BrowseDescription_copy(descr, &cp->browseDescription);
        cp->maxReferences = maxrefs;
        cp->continuationIndex = (UA_UInt32)referencesCount;
        UA_Guid *ident = UA_Guid_new();
        *ident = UA_Guid_random();
        cp->identifier.data = (UA_Byte*)ident;
        cp->identifier.length = sizeof(UA_Guid);
        UA_ByteString_copy(&cp->identifier, &result->continuationPoint);

        /* store the cp */
        LIST_INSERT_HEAD(&session->continuationPoints, cp, pointers);
        --session->availableContinuationPoints;
    }
}